

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall
wasm::BinaryInstWriter::visitStringMeasure(BinaryInstWriter *this,StringMeasure *curr)

{
  BufferWithRandomAccess *pBVar1;
  U32LEB local_20;
  U32LEB local_1c;
  StringMeasure *local_18;
  StringMeasure *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (StringMeasure *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  if (local_18->op == StringMeasureUTF8) {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x83);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  }
  else {
    if (local_18->op != StringMeasureWTF16) {
      handle_unreachable("invalid string.new*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa0d);
    }
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x85);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStringMeasure(StringMeasure* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringMeasureUTF8:
      o << U32LEB(BinaryConsts::StringMeasureUTF8);
      break;
    case StringMeasureWTF16:
      o << U32LEB(BinaryConsts::StringMeasureWTF16);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}